

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O1

size_t suboptimality(svm_model *model,double *subopt)

{
  float *pfVar1;
  svm_example *psVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  
  if (model->num_support == 0) {
    return 0;
  }
  dVar5 = 0.0;
  sVar3 = 0;
  sVar4 = 0;
  do {
    psVar2 = (model->support_vec)._begin[sVar4];
    fVar7 = (model->alpha)._begin[sVar4] * (psVar2->ex).l.simple.label;
    if (((psVar2->ex).l.simple.weight <= fVar7) ||
       (pfVar1 = (model->delta)._begin + sVar4, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
      dVar6 = 0.0;
      if ((0.0 < fVar7) && (dVar6 = 0.0, 0.0 < (model->delta)._begin[sVar4])) goto LAB_00227042;
    }
    else {
LAB_00227042:
      dVar6 = (double)ABS((model->delta)._begin[sVar4]);
    }
    subopt[sVar4] = dVar6;
    if (dVar5 < dVar6) {
      sVar3 = sVar4;
      dVar5 = dVar6;
    }
    sVar4 = sVar4 + 1;
    if (model->num_support <= sVar4) {
      return sVar3;
    }
  } while( true );
}

Assistant:

size_t suboptimality(svm_model* model, double* subopt)
{
  size_t max_pos = 0;
  // cerr<<"Subopt ";
  double max_val = 0;
  for (size_t i = 0; i < model->num_support; i++)
  {
    float tmp = model->alpha[i] * model->support_vec[i]->ex.l.simple.label;

    if ((tmp < model->support_vec[i]->ex.l.simple.weight && model->delta[i] < 0) || (tmp > 0 && model->delta[i] > 0))
      subopt[i] = fabs(model->delta[i]);
    else
      subopt[i] = 0;

    if (subopt[i] > max_val)
    {
      max_val = subopt[i];
      max_pos = i;
    }
    // cerr<<subopt[i]<<" ";
  }
  // cerr<<endl;
  return max_pos;
}